

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# marray.hxx
# Opt level: O2

void __thiscall
andres::marray_detail::Geometry<std::allocator<unsigned_long>_>::resize
          (Geometry<std::allocator<unsigned_long>_> *this,size_t dimension)

{
  unsigned_long *puVar1;
  ulong uVar2;
  unsigned_long *puVar3;
  size_t *psVar4;
  size_t sVar5;
  ulong j;
  
  if (this->dimension_ != dimension) {
    j = 0;
    puVar3 = __gnu_cxx::new_allocator<unsigned_long>::allocate
                       ((new_allocator<unsigned_long> *)this,dimension * 3,(void *)0x0);
    puVar1 = puVar3 + dimension;
    while( true ) {
      uVar2 = this->dimension_;
      sVar5 = dimension;
      if (uVar2 < dimension) {
        sVar5 = uVar2;
      }
      if (sVar5 <= j) break;
      psVar4 = shape(this,j);
      puVar3[j] = *psVar4;
      psVar4 = shapeStrides(this,j);
      puVar1[j] = *psVar4;
      psVar4 = strides(this,j);
      puVar3[dimension * 2 + j] = *psVar4;
      j = j + 1;
    }
    operator_delete(this->shape_,uVar2 * 0x18);
    this->shape_ = puVar3;
    this->shapeStrides_ = puVar1;
    this->strides_ = puVar1 + dimension;
    this->dimension_ = dimension;
  }
  return;
}

Assistant:

inline void 
Geometry<A>::resize
(
    const std::size_t dimension
)
{
    if(dimension != dimension_) {
        std::size_t* newShape = allocator_.allocate(dimension*3);
        std::size_t* newShapeStrides = newShape + dimension;
        std::size_t* newStrides = newShapeStrides + dimension; 
        for(std::size_t j=0; j<( (dimension < dimension_) ? dimension : dimension_); ++j) {
            // save existing entries
            newShape[j] = shape(j);
            newShapeStrides[j] = shapeStrides(j);
            newStrides[j] = strides(j);
        }
        allocator_.deallocate(shape_, dimension_*3);
        shape_ = newShape;
        shapeStrides_ = newShapeStrides;
        strides_ = newStrides;
        dimension_ = dimension;
    }
}